

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O2

void __thiscall
AddrManImpl::AddrManImpl
          (AddrManImpl *this,NetGroupManager *netgroupman,bool deterministic,
          int32_t consistency_check_ratio)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  base_blob<256U> *pbVar3;
  nid_type (*panVar4) [64];
  long lVar5;
  undefined7 in_register_00000011;
  long lVar6;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined8 *)((long)&(this->cs).super_mutex.super___mutex_base._M_mutex + 0x10) = 0;
  (this->cs).super_mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->cs).super_mutex.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->cs).super_mutex.super___mutex_base._M_mutex + 8) = 0;
  (this->cs).super_mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  FastRandomContext::FastRandomContext(&this->insecure_rand,deterministic);
  if ((int)CONCAT71(in_register_00000011,deterministic) == 0) {
    RandomMixin<FastRandomContext>::rand256
              (&this->nKey,&(this->insecure_rand).super_RandomMixin<FastRandomContext>);
  }
  else {
    pbVar3 = &(this->nKey).super_base_blob<256U>;
    (pbVar3->m_data)._M_elems[0x10] = '\0';
    (pbVar3->m_data)._M_elems[0x11] = '\0';
    (pbVar3->m_data)._M_elems[0x12] = '\0';
    (pbVar3->m_data)._M_elems[0x13] = '\0';
    (pbVar3->m_data)._M_elems[0x14] = '\0';
    (pbVar3->m_data)._M_elems[0x15] = '\0';
    (pbVar3->m_data)._M_elems[0x16] = '\0';
    (pbVar3->m_data)._M_elems[0x17] = '\0';
    pbVar3 = &(this->nKey).super_base_blob<256U>;
    (pbVar3->m_data)._M_elems[0x18] = '\0';
    (pbVar3->m_data)._M_elems[0x19] = '\0';
    (pbVar3->m_data)._M_elems[0x1a] = '\0';
    (pbVar3->m_data)._M_elems[0x1b] = '\0';
    (pbVar3->m_data)._M_elems[0x1c] = '\0';
    (pbVar3->m_data)._M_elems[0x1d] = '\0';
    (pbVar3->m_data)._M_elems[0x1e] = '\0';
    (pbVar3->m_data)._M_elems[0x1f] = '\0';
    pbVar3 = &(this->nKey).super_base_blob<256U>;
    (pbVar3->m_data)._M_elems[1] = '\0';
    (pbVar3->m_data)._M_elems[2] = '\0';
    (pbVar3->m_data)._M_elems[3] = '\0';
    (pbVar3->m_data)._M_elems[4] = '\0';
    (pbVar3->m_data)._M_elems[5] = '\0';
    (pbVar3->m_data)._M_elems[6] = '\0';
    (pbVar3->m_data)._M_elems[7] = '\0';
    (pbVar3->m_data)._M_elems[8] = '\0';
    pbVar3 = &(this->nKey).super_base_blob<256U>;
    (pbVar3->m_data)._M_elems[9] = '\0';
    (pbVar3->m_data)._M_elems[10] = '\0';
    (pbVar3->m_data)._M_elems[0xb] = '\0';
    (pbVar3->m_data)._M_elems[0xc] = '\0';
    (pbVar3->m_data)._M_elems[0xd] = '\0';
    (pbVar3->m_data)._M_elems[0xe] = '\0';
    (pbVar3->m_data)._M_elems[0xf] = '\0';
    (pbVar3->m_data)._M_elems[0x10] = '\0';
    (this->nKey).super_base_blob<256U>.m_data._M_elems[0] = '\x01';
  }
  this->nIdCount = 0;
  (this->mapInfo)._M_h._M_buckets = &(this->mapInfo)._M_h._M_single_bucket;
  (this->mapInfo)._M_h._M_bucket_count = 1;
  (this->mapInfo)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->mapInfo)._M_h._M_element_count = 0;
  (this->mapInfo)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->mapInfo)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->mapInfo)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  _Hashtable<CService,_std::pair<const_CService,_long>,_std::allocator<std::pair<const_CService,_long>_>,_std::__detail::_Select1st,_std::equal_to<CService>,_CServiceHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Hashtable(&(this->mapAddr)._M_h);
  this->nNew = 0;
  (this->vRandom).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->vRandom).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->vRandom).super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->vRandom).super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (this->m_last_good).__d.__r = 1;
  p_Var1 = &(this->m_tried_collisions)._M_t._M_impl.super__Rb_tree_header;
  (this->m_tried_collisions)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_tried_collisions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->m_tried_collisions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_tried_collisions)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_tried_collisions)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->m_consistency_check_ratio = consistency_check_ratio;
  this->m_netgroupman = netgroupman;
  (this->m_network_counts)._M_h._M_buckets = &(this->m_network_counts)._M_h._M_single_bucket;
  (this->m_network_counts)._M_h._M_bucket_count = 1;
  (this->m_network_counts)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_network_counts)._M_h._M_element_count = 0;
  (this->m_network_counts)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_network_counts)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_network_counts)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  panVar4 = this->vvNew;
  lVar5 = 0x20180;
  while (lVar5 != 0xa0180) {
    lVar5 = lVar5 + 0x200;
    for (lVar6 = 0; lVar6 != 0x200; lVar6 = lVar6 + 8) {
      *(undefined8 *)((long)*panVar4 + lVar6) = 0xffffffffffffffff;
    }
    panVar4 = panVar4 + 1;
  }
  panVar4 = this->vvTried;
  lVar5 = 0x178;
  while (lVar5 != 0x20178) {
    lVar5 = lVar5 + 0x200;
    for (lVar6 = 0; lVar6 != 0x200; lVar6 = lVar6 + 8) {
      *(undefined8 *)((long)*panVar4 + lVar6) = 0xffffffffffffffff;
    }
    panVar4 = panVar4 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

AddrManImpl::AddrManImpl(const NetGroupManager& netgroupman, bool deterministic, int32_t consistency_check_ratio)
    : insecure_rand{deterministic}
    , nKey{deterministic ? uint256{1} : insecure_rand.rand256()}
    , m_consistency_check_ratio{consistency_check_ratio}
    , m_netgroupman{netgroupman}
{
    for (auto& bucket : vvNew) {
        for (auto& entry : bucket) {
            entry = -1;
        }
    }
    for (auto& bucket : vvTried) {
        for (auto& entry : bucket) {
            entry = -1;
        }
    }
}